

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factor(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **vec,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *threshold,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *eps)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  Temp::init(&this->temp,(EVP_PKEY_CTX *)(ulong)(uint)this->thedim);
  if (0 < this->thedim) {
    piVar1 = (this->col).perm;
    piVar2 = (this->col).orig;
    piVar3 = (this->row).orig;
    piVar4 = (this->row).perm;
    lVar6 = 0;
    do {
      piVar1[lVar6] = -1;
      piVar2[lVar6] = -1;
      piVar4[lVar6] = -1;
      piVar3[lVar6] = -1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->thedim);
  }
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  initFactorMatrix(this,vec,&local_68);
  if (this->stat == OK) {
    colSingletons(this);
    if (this->stat == OK) {
      rowSingletons(this);
      if ((this->stat == OK) && ((this->temp).stage < this->thedim)) {
        initFactorRings(this);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2)
        ;
        local_a8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_a8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_a8.m_backend.exp = (eps->m_backend).exp;
        local_a8.m_backend.neg = (eps->m_backend).neg;
        local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
        local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(threshold->m_backend).data._M_elems
        ;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((threshold->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((threshold->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((threshold->m_backend).data._M_elems + 6);
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((threshold->m_backend).data._M_elems + 8);
        local_e8.m_backend.exp = (threshold->m_backend).exp;
        local_e8.m_backend.neg = (threshold->m_backend).neg;
        local_e8.m_backend.fpclass = (threshold->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (threshold->m_backend).prec_elem;
        eliminateNucleus(this,&local_a8,&local_e8);
        freeFactorRings(this);
      }
    }
  }
  (this->l).firstUpdate = (this->l).firstUnused;
  if (this->stat == OK) {
    setupRowVals(this);
    iVar5 = setupColVals(this);
    this->nzCnt = iVar5;
  }
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

void CLUFactor<R>::factor(const SVectorBase<R>**
                          vec,          ///< Array of column VectorBase<R> pointers
                          R            threshold,    ///< pivoting threshold
                          R            eps)          ///< epsilon for zero detection
{

   factorTime->start();

   this->stat = SLinSolver<R>::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec, eps);

   if(this->stat)
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   rowSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      initFactorRings();
      eliminateNucleus(eps, threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(this->stat == SLinSolver<R>::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}